

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QStyleOptionGraphicsItem>::moveAppend
          (QGenericArrayOps<QStyleOptionGraphicsItem> *this,QStyleOptionGraphicsItem *b,
          QStyleOptionGraphicsItem *e)

{
  QStyleOptionGraphicsItem *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QStyleOptionGraphicsItem *in_RDI;
  QStyleOptionGraphicsItem *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QStyleOptionGraphicsItem>::begin
                        ((QArrayDataPointer<QStyleOptionGraphicsItem> *)0xa489f7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QStyleOptionGraphicsItem::QStyleOptionGraphicsItem(this_00,in_RDI);
      local_10 = local_10 + 0x60;
      *(long *)&(in_RDI->super_QStyleOption).rect = *(long *)&(in_RDI->super_QStyleOption).rect + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }